

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

char * __thiscall
llvm::ItaniumPartialDemangler::getFunctionBaseName
          (ItaniumPartialDemangler *this,char *Buf,size_t *N)

{
  Kind KVar1;
  Node *RootNode;
  long lVar2;
  bool bVar3;
  char *pcVar4;
  long lVar5;
  undefined8 *puVar6;
  
  bVar3 = isFunction(this);
  if (bVar3) {
    puVar6 = (undefined8 *)((long)this->RootNode + 0x18);
    lVar2 = 0x10;
    while( true ) {
      RootNode = (Node *)*puVar6;
      KVar1 = RootNode->K;
      lVar5 = lVar2;
      if ((((KVar1 != KAbiTagAttr) && (lVar5 = 0x18, KVar1 != KNestedName)) && (KVar1 != KLocalName)
          ) && ((lVar5 = lVar2, KVar1 != KStdQualifiedName && (KVar1 != KNameWithTemplateArgs))))
      break;
      puVar6 = (undefined8 *)((long)&RootNode->_vptr_Node + lVar5);
    }
    pcVar4 = printNode(RootNode,Buf,N);
    return pcVar4;
  }
  return (char *)0x0;
}

Assistant:

char *ItaniumPartialDemangler::getFunctionBaseName(char *Buf, size_t *N) const {
  if (!isFunction())
    return nullptr;

  Node *Name = static_cast<FunctionEncoding *>(RootNode)->getName();

  while (true) {
    switch (Name->getKind()) {
    case Node::KAbiTagAttr:
      Name = static_cast<AbiTagAttr *>(Name)->Base;
      continue;
    case Node::KStdQualifiedName:
      Name = static_cast<StdQualifiedName *>(Name)->Child;
      continue;
    case Node::KNestedName:
      Name = static_cast<NestedName *>(Name)->Name;
      continue;
    case Node::KLocalName:
      Name = static_cast<LocalName *>(Name)->Entity;
      continue;
    case Node::KNameWithTemplateArgs:
      Name = static_cast<NameWithTemplateArgs *>(Name)->Name;
      continue;
    default:
      return printNode(Name, Buf, N);
    }
  }
}